

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall
Catch::SonarQubeReporter::testRunStarting(SonarQubeReporter *this,TestRunInfo *testRunInfo)

{
  XmlFormatting XVar1;
  IConfig *config;
  char local_91;
  StringRef local_90;
  allocator<char> local_79;
  string local_78;
  string local_48;
  StringRef local_28;
  TestRunInfo *local_18;
  TestRunInfo *testRunInfo_local;
  SonarQubeReporter *this_local;
  
  local_18 = testRunInfo;
  testRunInfo_local = (TestRunInfo *)this;
  CumulativeReporterBase::testRunStarting(&this->super_CumulativeReporterBase,testRunInfo);
  (anonymous_namespace)::createMetadataString_abi_cxx11_
            (&local_48,
             (_anonymous_namespace_ *)
             (this->super_CumulativeReporterBase).super_ReporterBase.super_IEventListener.m_config,
             config);
  StringRef::StringRef(&local_28,&local_48);
  XVar1 = operator|(Newline,Indent);
  XmlWriter::writeComment(&this->xml,local_28,XVar1);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"testExecutions",&local_79)
  ;
  XVar1 = operator|(Newline,Indent);
  XmlWriter::startElement(&this->xml,&local_78,XVar1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  local_90 = operator____sr("version",7);
  local_91 = '1';
  XmlWriter::writeAttribute<char,void>(&this->xml,local_90,&local_91);
  return;
}

Assistant:

void SonarQubeReporter::testRunStarting(TestRunInfo const& testRunInfo) {
        CumulativeReporterBase::testRunStarting(testRunInfo);

        xml.writeComment( createMetadataString( *m_config ) );
        xml.startElement("testExecutions");
        xml.writeAttribute("version"_sr, '1');
    }